

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::EM(IMLE *this,Z *z,X *x)

{
  bool bVar1;
  size_type sVar2;
  ostream *this_00;
  pointer pFVar3;
  ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> AVar4;
  ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> scalar;
  ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> scalar_00;
  long in_RDI;
  Scal SVar5;
  double __x;
  double dVar6;
  double __x_00;
  Scalar SVar7;
  double dVar8;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  Scal tmp;
  iterator it_3;
  X sum_diagPsi;
  Z sum_diagSigma;
  iterator it_2;
  iterator it_1;
  iterator it;
  Scal sum_h;
  Scal h;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
  *in_stack_fffffffffffff828;
  vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
  *in_stack_fffffffffffff830;
  value_type *in_stack_fffffffffffff838;
  FastLinearExpert *in_stack_fffffffffffff840;
  MatrixBase<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_fffffffffffff848;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffff850;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffff858;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff860;
  StorageBaseType *in_stack_fffffffffffff870;
  double *in_stack_fffffffffffff878;
  double *in_stack_fffffffffffff880;
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffff888;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_690 [192];
  NestedExpressionType local_5d0;
  double local_5c8;
  NestedExpressionType local_5c0;
  NestedExpressionType local_5b8;
  NestedExpressionType local_5b0;
  Scal in_stack_fffffffffffffa58;
  X *in_stack_fffffffffffffa60;
  Z *in_stack_fffffffffffffa68;
  FastLinearExpert *in_stack_fffffffffffffa70;
  IMLE *in_stack_fffffffffffffb20;
  X *in_stack_fffffffffffffb28;
  Z *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  FastLinearExpert *in_stack_fffffffffffffb40;
  __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
  local_3b0 [5];
  FastLinearExpert *local_388;
  FastLinearExpert *local_380;
  __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
  local_378;
  FastLinearExpert *local_370;
  FastLinearExpert *local_368;
  __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
  local_360 [32];
  FastLinearExpert *in_stack_fffffffffffffda0;
  __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
  local_30;
  double local_28;
  double local_20;
  
  local_28 = 0.0;
  local_30._M_current =
       (FastLinearExpert *)
       std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::begin
                 ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   *)in_stack_fffffffffffff828);
  while( true ) {
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::end
              ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
               in_stack_fffffffffffff828);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                        *)in_stack_fffffffffffff830,
                       (__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                        *)in_stack_fffffffffffff828);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
             ::operator->(&local_30);
    SVar5 = LinearExpert::get_h(&pFVar3->super_LinearExpert);
    local_28 = SVar5 + local_28;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
    ::operator++((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                  *)in_stack_fffffffffffff838,(int)((ulong)in_stack_fffffffffffff830 >> 0x20));
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
      local_378._M_current =
           (FastLinearExpert *)
           std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           begin((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)in_stack_fffffffffffff828);
      while( true ) {
        local_380 = (FastLinearExpert *)
                    std::
                    vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ::end((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)in_stack_fffffffffffff828);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                            *)in_stack_fffffffffffff830,
                           (__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                            *)in_stack_fffffffffffff828);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
        ::operator->(&local_378);
        pFVar3 = __gnu_cxx::
                 __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                 ::operator->(&local_378);
        LinearExpert::get_h(&pFVar3->super_LinearExpert);
        FastLinearExpert::e_step
                  (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   in_stack_fffffffffffffa58);
        __gnu_cxx::
        __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
        ::operator->(&local_378);
        FastLinearExpert::m_step(in_stack_fffffffffffffda0);
        local_388 = (FastLinearExpert *)
                    __gnu_cxx::
                    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                    ::operator++((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                                  *)in_stack_fffffffffffff838,
                                 (int)((ulong)in_stack_fffffffffffff830 >> 0x20));
      }
    }
    else {
      local_360[0]._M_current =
           (FastLinearExpert *)
           std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           begin((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)in_stack_fffffffffffff828);
      while( true ) {
        local_368 = (FastLinearExpert *)
                    std::
                    vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ::end((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)in_stack_fffffffffffff828);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                            *)in_stack_fffffffffffff830,
                           (__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                            *)in_stack_fffffffffffff828);
        if (!bVar1) break;
        pFVar3 = __gnu_cxx::
                 __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                 ::operator->(local_360);
        SVar5 = LinearExpert::get_h(&pFVar3->super_LinearExpert);
        local_20 = SVar5 / local_28;
        if (0.001 < local_20) {
          __gnu_cxx::
          __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
          ::operator->(local_360);
          FastLinearExpert::e_step
                    (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                     in_stack_fffffffffffffa58);
          __gnu_cxx::
          __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
          ::operator->(local_360);
          FastLinearExpert::m_step(in_stack_fffffffffffffda0);
        }
        local_370 = (FastLinearExpert *)
                    __gnu_cxx::
                    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                    ::operator++((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                                  *)in_stack_fffffffffffff838,
                                 (int)((ulong)in_stack_fffffffffffff830 >> 0x20));
      }
    }
  }
  else {
    FastLinearExpert::FastLinearExpert
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38,
               in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
    push_back((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
              in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    FastLinearExpert::~FastLinearExpert(in_stack_fffffffffffff840);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::back
              (in_stack_fffffffffffff830);
    FastLinearExpert::e_step
              (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
               in_stack_fffffffffffffa58);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::back
              (in_stack_fffffffffffff830);
    FastLinearExpert::m_step(in_stack_fffffffffffffda0);
    sVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
            size((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0));
    *(int *)(in_RDI + 200) = (int)sVar2;
    this_00 = std::operator<<((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff830,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff828);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff830,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff828);
  local_3b0[0]._M_current =
       (FastLinearExpert *)
       std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::begin
                 ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   *)in_stack_fffffffffffff828);
  while( true ) {
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::end
              ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
               in_stack_fffffffffffff828);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                        *)in_stack_fffffffffffff830,
                       (__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                        *)in_stack_fffffffffffff828);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
    ::operator->(local_3b0);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff838);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    __gnu_cxx::
    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
    ::operator->(local_3b0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff850,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff848);
    __gnu_cxx::
    __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
    ::operator++((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                  *)in_stack_fffffffffffff838,(int)((ulong)in_stack_fffffffffffff830 >> 0x20));
  }
  Eigen::operator*(in_stack_fffffffffffff878,(StorageBaseType *)in_stack_fffffffffffff870);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff830,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff828);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff828);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::operator+=
            (in_stack_fffffffffffff860,(Scalar *)in_stack_fffffffffffff858);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff828);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::sqrt
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             &stack0xfffffffffffffb20,__x);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>>
  ::operator+(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff828);
  Eigen::operator*(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
  ::operator/(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff828);
  Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff830,
             in_stack_fffffffffffff828);
  dVar6 = ((double)*(int *)(in_RDI + 200) * *(double *)(in_RDI + 0x60) - *(double *)(in_RDI + 0x40))
          * 0.5 + -1.0;
  local_5b0 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffff828);
  Eigen::operator*(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  local_5b8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffff828);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>>
  ::operator*((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)in_stack_fffffffffffff858,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
              in_stack_fffffffffffff850);
  AVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffff828);
  local_5c0 = (NestedExpressionType)AVar4;
  Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff830,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffff828);
  local_5c8 = dVar6 * dVar6;
  scalar = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                      in_stack_fffffffffffff828);
  local_5d0 = (NestedExpressionType)scalar;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::operator+=
            (in_stack_fffffffffffff860,(Scalar *)in_stack_fffffffffffff858);
  scalar_00 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffff828);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::sqrt
            (local_690,__x_00);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>>
  ::operator+((ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)AVar4.m_expression,(double *)scalar.m_expression);
  AVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffff828);
  Eigen::operator*((double *)scalar_00.m_expression,(StorageBaseType *)AVar4.m_expression);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
  ::operator/(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff828);
  Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff830,
             in_stack_fffffffffffff828);
  dVar6 = *(double *)(in_RDI + 0x120);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff838
                    );
  dVar8 = sqrt(SVar7);
  *(double *)(in_RDI + 0x108) = dVar6 / dVar8;
  dVar6 = *(double *)(in_RDI + 0x118);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff838
                    );
  dVar8 = sqrt(SVar7);
  *(double *)(in_RDI + 0x100) = dVar6 / dVar8;
  dVar6 = *(double *)(in_RDI + 0x128);
  this_01 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                      ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffff838);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(this_01);
  dVar8 = sqrt((double)this_01 * SVar7);
  *(double *)(in_RDI + 0x110) = dVar6 / dVar8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fa82d);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fa83c);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}